

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::NotifyFree(Recycler *this,char *address,size_t size)

{
  bool bVar1;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar2 [16];
  
  if (this->recyclerFlagsTable->Verbose == true) {
    bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar1) {
      Output::Print(L"Sweeping object %p\n",address);
    }
  }
  bVar1 = BinaryFeatureControl::RecyclerTest();
  if ((bVar1) && (this->checkFn != (_func_BOOL_char_ptr_size_t *)0x0)) {
    (*this->checkFn)(address,size);
  }
  RecyclerMemoryTracking::ReportFree(this,address,size);
  auVar2 = extraout_XMM0;
  if (this->verifyEnabled != false) {
    VerifyCheckPad(this,address,size);
    auVar2 = extraout_XMM0_00;
  }
  if (DAT_0145c441 == '\0') {
    TrackFree(this,address,size);
    auVar2 = extraout_XMM0_01;
  }
  auVar2 = pmovsxbq(auVar2,0x101);
  (this->collectionStats).objectSweptCount = (this->collectionStats).objectSweptCount + auVar2._0_8_
  ;
  (this->collectionStats).objectSweptBytes = (this->collectionStats).objectSweptBytes + size;
  if (this->isForceSweeping == false) {
    (this->collectionStats).objectSweptFreeListCount =
         (this->collectionStats).objectSweptFreeListCount + auVar2._0_8_;
    (this->collectionStats).objectSweptFreeListBytes =
         (this->collectionStats).objectSweptFreeListBytes + size;
  }
  return;
}

Assistant:

void
Recycler::NotifyFree(__in char *address, size_t size)
{
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("Sweeping object %p\n"), address);

#ifdef RECYCLER_TEST_SUPPORT
    if (BinaryFeatureControl::RecyclerTest())
    {
        if (checkFn != NULL)
            checkFn(address, size);
    }
#endif

#ifdef ENABLE_JS_ETW
    if (EventEnabledJSCRIPT_RECYCLER_FREE_MEMORY())
    {
        AppendFreeMemoryETWRecord(address, (UINT)size);
    }
#endif

    RecyclerMemoryTracking::ReportFree(this, address, size);
    RECYCLER_PERF_COUNTER_DEC(LiveObject);
    RECYCLER_PERF_COUNTER_SUB(LiveObjectSize, size);
    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, size);

    if (HeapInfo::IsSmallBlockAllocation(HeapInfo::GetAlignedSizeNoCheck(size)))
    {
        RECYCLER_PERF_COUNTER_DEC(SmallHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockLiveObjectSize, size);
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockFreeObjectSize, size);
    }
    else
    {
        RECYCLER_PERF_COUNTER_DEC(LargeHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockLiveObjectSize, size);
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockFreeObjectSize, size);
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (this->VerifyEnabled())
    {
        VerifyCheckPad(address, size);
    }
#endif

#ifdef PROFILE_RECYCLER_ALLOC
    if (!CONFIG_FLAG(KeepRecyclerTrackData))
    {
        TrackFree(address, size);
    }
#endif

#ifdef RECYCLER_STATS
    collectionStats.objectSweptCount++;
    collectionStats.objectSweptBytes += size;

    if (!isForceSweeping)
    {
        collectionStats.objectSweptFreeListCount++;
        collectionStats.objectSweptFreeListBytes += size;
    }
#endif
}